

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cxx
# Opt level: O0

int __thiscall Display::plot(Display *this)

{
  uint uVar1;
  ofstream *poVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  long lVar8;
  char *__command;
  vector<Plot,_std::allocator<Plot>_> *this_00;
  string local_1f8 [55];
  allocator<char> local_1c1;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  ostringstream command;
  uint local_28;
  uint i;
  bool firstPlot;
  int oldMode;
  int mode;
  Display *this_local;
  
  if (this->pFile == (ofstream *)0x0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"instruction file error");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 1;
  }
  else {
    i = 0;
    bVar3 = true;
    poVar5 = std::operator<<((ostream *)this->pFile,"set title ");
    poVar5 = std::operator<<(poVar5,(string *)&this->sTitle);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)this->pFile,"set multiplot");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"set grid");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (local_28 = 0; sVar6 = std::vector<Plot,_std::allocator<Plot>_>::size(&this->vPlots),
        local_28 < sVar6; local_28 = local_28 + 1) {
      pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28);
      uVar1 = pvVar7->nMode;
      if ((uVar1 & 0x3e0) != (i & 0x3e0)) {
        std::ostream::operator<<(this->pFile,std::endl<char,std::char_traits<char>>);
        uVar4 = uVar1 & 0x3e0;
        if (uVar4 == 0x20) {
          poVar5 = std::operator<<((ostream *)this->pFile,"unset grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.5,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 0.5,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0x40) {
          poVar5 = std::operator<<((ostream *)this->pFile,"unset grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.0,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 0.5,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0x60) {
          poVar5 = std::operator<<((ostream *)this->pFile,"unset grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.5,0.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 0.5,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0x80) {
          poVar5 = std::operator<<((ostream *)this->pFile,"unset grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.0,0.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 0.5,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0xa0) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.0,0.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 0.5,1.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0xc0) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.5,0.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 0.5,1.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0xe0) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.0,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 1.0,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0x100) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set grid");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set origin 0.0,0.0");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"set size 1.0,0.5");
          poVar5 = (ostream *)
                   std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"clear");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        bVar3 = true;
      }
      if (bVar3) {
        poVar5 = std::operator<<((ostream *)this->pFile,"set xtics font \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->sXTicFont);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)this->pFile,"set ytics font \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->sYTicFont);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)this->pFile,"set ztics font \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->sZTicFont);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)this->pFile,"set xlabel \"");
        this_00 = &this->vPlots;
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](this_00,(ulong)local_28);
        poVar5 = std::operator<<(poVar5,(string *)&pvVar7->sXLabel);
        poVar5 = std::operator<<(poVar5,"\" font \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->sXFont);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)this->pFile,"set ylabel \"");
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](this_00,(ulong)local_28);
        poVar5 = std::operator<<(poVar5,(string *)&pvVar7->sYLabel);
        poVar5 = std::operator<<(poVar5,"\" font \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->sYFont);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)this->pFile,"set zlabel \"");
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](this_00,(ulong)local_28);
        poVar5 = std::operator<<(poVar5,(string *)&pvVar7->sZLabel);
        poVar5 = std::operator<<(poVar5,"\" font \"");
        poVar5 = std::operator<<(poVar5,(string *)&this->sZFont);
        poVar5 = std::operator<<(poVar5,"\"");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = std::operator<<((ostream *)this->pFile,(string *)&this->sUserSettings);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar2 = this->pFile;
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](this_00,(ulong)local_28);
        poVar5 = std::operator<<((ostream *)poVar2,(string *)&pvVar7->sUserSettings);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        uVar4 = uVar1 & 0x1c00;
        if (uVar4 == 0x400) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set logscale x");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0x800) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set logscale y ");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        else if (uVar4 == 0x1000) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set logscale z");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        }
        uVar4 = uVar1 & 3;
        if (uVar4 == 0) {
          std::operator<<((ostream *)this->pFile,"plot ");
        }
        else if (uVar4 == 1) {
          std::operator<<((ostream *)this->pFile,"splot ");
        }
        else if (uVar4 == 2) {
          poVar5 = std::operator<<((ostream *)this->pFile,"set pm3d map");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::operator<<((ostream *)this->pFile,"splot ");
        }
      }
      else {
        std::operator<<((ostream *)this->pFile,", ");
      }
      poVar2 = this->pFile;
      pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28);
      std::operator<<((ostream *)poVar2,(string *)pvVar7);
      std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28);
      lVar8 = std::__cxx11::string::length();
      if (lVar8 != 0) {
        poVar5 = std::operator<<((ostream *)this->pFile," using ");
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28)
        ;
        std::operator<<(poVar5,(string *)&pvVar7->sUsedDimensions);
      }
      poVar5 = std::operator<<((ostream *)this->pFile," title \" ");
      pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28);
      poVar5 = std::operator<<(poVar5,(string *)&pvVar7->sName);
      std::operator<<(poVar5,"\" ");
      switch(uVar1 & 0x1c) {
      case 0:
        std::operator<<((ostream *)this->pFile,"with lines ");
        break;
      case 4:
        std::operator<<((ostream *)this->pFile,"with points ");
        break;
      case 8:
        std::operator<<((ostream *)this->pFile,"with dots ");
        break;
      case 0xc:
        std::operator<<((ostream *)this->pFile,"with image ");
        break;
      case 0x10:
        std::operator<<((ostream *)this->pFile,"with boxes ");
        break;
      case 0x14:
        std::operator<<((ostream *)this->pFile,"with filledcurves y1=0");
        break;
      case 0x18:
        std::operator<<((ostream *)this->pFile,"with linespoints ");
        break;
      case 0x1c:
        std::operator<<((ostream *)this->pFile," ");
      }
      pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28);
      if (pvVar7->nLineStyle != 0) {
        poVar5 = std::operator<<((ostream *)this->pFile,"ls ");
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28)
        ;
        std::ostream::operator<<(poVar5,pvVar7->nLineStyle);
      }
      pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28);
      if (pvVar7->nLineWidth != 0) {
        poVar5 = std::operator<<((ostream *)this->pFile,"lw ");
        pvVar7 = std::vector<Plot,_std::allocator<Plot>_>::operator[](&this->vPlots,(ulong)local_28)
        ;
        std::ostream::operator<<(poVar5,pvVar7->nLineWidth);
      }
      bVar3 = false;
      i = uVar1;
    }
    poVar5 = (ostream *)std::ostream::operator<<(this->pFile,std::endl<char,std::char_traits<char>>)
    ;
    poVar5 = std::operator<<(poVar5,"unset multiplot");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this->pFile,std::flush<char,std::char_traits<char>>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c0,"",&local_1c1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0,local_1c0,_S_out);
    std::__cxx11::string::~string(local_1c0);
    std::allocator<char>::~allocator(&local_1c1);
    poVar5 = std::operator<<((ostream *)local_1a0,"/usr/bin/gnuplot ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*background:#e0e0a0\" ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*line1Color:blue\" ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*line2Color:red\" ");
    poVar5 = std::operator<<(poVar5,"-xrm \"gnuplot*line3Color:darkgrey\" ");
    std::operator<<(poVar5,"-persist -title \"NeuroLab :: Plot\" ");
    poVar5 = std::operator<<((ostream *)local_1a0,(string *)this);
    poVar5 = std::operator<<(poVar5,".gnuplot");
    std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    __command = (char *)std::__cxx11::string::c_str();
    system(__command);
    std::__cxx11::string::~string(local_1f8);
    this_local._4_4_ = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  }
  return this_local._4_4_;
}

Assistant:

int Display::plot()
{
	// sort plot vector by plot-mode
	// not implemented yet
	if(pFile) {
		int mode = 0; // start with default mode
		int oldMode = 0; // to detect mode changes -> set different coordinates for subplots
		bool firstPlot = true; // the first plot get a different command
		
		(*pFile) << "set title " << sTitle << endl;
		(*pFile) << "set multiplot" << endl << "set grid" << endl;
		for(uint i=0; i<vPlots.size(); i++) {
			mode = vPlots[i].nMode;
			
			// set new position when changed
			if( (mode & DSP_POSITION_MASK) != (oldMode & DSP_POSITION_MASK) ) {
				(*pFile) << endl;
				switch( mode & DSP_POSITION_MASK ) {
					case DSP_TOP_LEFT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.0,0.5" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_TOP_RIGHT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.5,0.5" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM_LEFT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM_RIGHT:
						(*pFile) << "unset grid" << endl
							<< "set origin 0.5,0.0" << endl
							<< "set size 0.5,0.5" << endl << "clear" << endl;
						break;
					case DSP_TOP:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.5" << endl
							<< "set size 1.0,0.5" << endl << "clear" << endl;
						break;
					case DSP_BOTTOM:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 1.0,0.5" << endl << "clear" << endl;
						break;
					case DSP_LEFT:
						(*pFile) << "set grid" << endl
							<< "set origin 0.0,0.0" << endl
							<< "set size 0.5,1.0" << endl << "clear" << endl;
						break;
					case DSP_RIGHT:
						(*pFile) << "set grid" << endl
							<< "set origin 0.5,0.0" << endl
							<< "set size 0.5,1.0" << endl << "clear" << endl;
						break;
				}
				firstPlot = true;
			}
			
			// append next plot
			if( firstPlot ) {
				(*pFile) << "set xtics font \"" << sXTicFont << "\"" << endl;
				(*pFile) << "set ytics font \"" << sYTicFont << "\"" << endl;
				(*pFile) << "set ztics font \"" << sZTicFont << "\"" << endl;
				(*pFile) << "set xlabel \"" << vPlots[i].sXLabel << "\" font \"" << sXFont << "\"" << endl;
				(*pFile) << "set ylabel \"" << vPlots[i].sYLabel << "\" font \"" << sYFont << "\"" << endl;
				(*pFile) << "set zlabel \"" << vPlots[i].sZLabel << "\" font \"" << sZFont << "\"" << endl;
				(*pFile) << sUserSettings << endl;
				(*pFile) << vPlots[i].sUserSettings << endl;
				switch(mode & (DSP_AXIS_MASK) ) {
					case DSP_X_AXIS_LOG:
						(*pFile) << "set logscale x" << endl;
						break;
					case DSP_Y_AXIS_LOG:
						(*pFile) << "set logscale y " << endl;
						break;
					case DSP_Z_AXIS_LOG:
						(*pFile) << "set logscale z" << endl;
				}
				switch(mode & (DSP_DIMENSION_MASK|DSP_COLOR_MASK)) {
					case DSP_3D:
						(*pFile) << "set pm3d map" << endl;
						(*pFile) << "splot ";
						break;
					case DSP_BW:;
						(*pFile) << "splot ";
						break;
					case DSP_2D:
						(*pFile) << "plot ";
				}
			} else 
				(*pFile) << ", ";
			
			(*pFile) << vPlots[i].sFunction;
			if (vPlots[i].sUsedDimensions.length() > 0)
				(*pFile) << " using " <<  vPlots[i].sUsedDimensions;
			(*pFile) <<  " title \" " << vPlots[i].sName << "\" " ;
			
			switch(mode & DSP_LINE_MASK) {
				case DSP_LINES:
					(*pFile) << "with lines "; 
					break;
				case DSP_POINTS:
					(*pFile) << "with points "; 
					break;
				case DSP_DOTS:
					(*pFile) << "with dots "; 
					break;
                case DSP_IMAGE:
                    (*pFile) << "with image ";
                    break;
                case DSP_BARS:
					(*pFile) << "with boxes "; 
					break;
				case DSP_FILLEDCURVES:
					(*pFile) << "with filledcurves y1=0";
					break;
				case DSP_LINESPOINTS:
					(*pFile) << "with linespoints ";
					break;
				case DSP_NOLINES:
					(*pFile) << " ";
			}
			if (vPlots[i].nLineStyle)
				(*pFile) << "ls " << vPlots[i].nLineStyle;
            if (vPlots[i].nLineWidth)
                (*pFile) << "lw " << vPlots[i].nLineWidth;
            firstPlot = false;
			oldMode = mode;
		}
		(*pFile) << endl << "unset multiplot" << endl;
		(*pFile) << flush;
		
        // run terminal + gnuplStyleStyleot
		ostringstream command("");
		command << GNUPLOT_EXECUTABLE
			<< "-xrm \"gnuplot*background:#e0e0a0\" "
			<< "-xrm \"gnuplot*line1Color:blue\" "
			<< "-xrm \"gnuplot*line2Color:red\" "
			<< "-xrm \"gnuplot*line3Color:darkgrey\" "
			<< "-persist -title \"NeuroLab :: Plot\" ";
//		command << "/usr/bin/gnuplot -title \"NeuroLab :: Plot\" ";
		command << sFileBase << ".gnuplot" << flush;
		system( command.str().c_str() );
		return 0;
	}
	else cout << "instruction file error" << endl;
	return 1;
}